

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O2

void cppcms::http::response::make_error_response_html_body(int stat,ostream *out,string *msg)

{
  ostream *poVar1;
  char *pcVar2;
  string local_50;
  
  poVar1 = std::operator<<(out,
                           "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.01 Transitional//EN\"\n\t\"http://www.w3.org/TR/html4/loose.dtd\">\n<html>\n  <head>\n    <title>"
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,stat);
  poVar1 = std::operator<<(poVar1," &mdash; ");
  pcVar2 = status_to_string(stat);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"</title>\n  </head>\n  <body>\n    <h1>");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,stat);
  poVar1 = std::operator<<(poVar1," &mdash; ");
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"</h1>\n");
  if (msg->_M_string_length != 0) {
    poVar1 = std::operator<<(out,"    <p>");
    util::escape(&local_50,msg);
    poVar1 = std::operator<<(poVar1,(string *)&local_50);
    std::operator<<(poVar1,"</p>\n");
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::operator<<(out,"  </body>\n</html>\n");
  return;
}

Assistant:

void response::make_error_response_html_body(int stat,std::ostream &out,std::string const &msg)
{
	out   <<"<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.01 Transitional//EN\"\n"
		"	\"http://www.w3.org/TR/html4/loose.dtd\">\n"
		"<html>\n"
		"  <head>\n"
		"    <title>"<<stat<<" &mdash; "<< http::response::status_to_string(stat)<<"</title>\n"
		"  </head>\n"
		"  <body>\n"
		"    <h1>"<<stat<<" &mdash; "<< http::response::status_to_string(stat)<<"</h1>\n";
	if(!msg.empty()) {
		out<<"    <p>"<<util::escape(msg)<<"</p>\n";
	}
	out  <<	"  </body>\n"
		"</html>\n";

}